

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O3

void __thiscall
cbtCollisionDispatcher::clearManifold(cbtCollisionDispatcher *this,cbtPersistentManifold *manifold)

{
  int iVar1;
  cbtManifoldPoint *pt;
  long lVar2;
  cbtPersistentManifold *local_20;
  
  iVar1 = manifold->m_cachedPoints;
  if (0 < iVar1) {
    pt = manifold->m_pointCache;
    lVar2 = 0;
    do {
      cbtPersistentManifold::clearUserCache(manifold,pt);
      iVar1 = manifold->m_cachedPoints;
      lVar2 = lVar2 + 1;
      pt = pt + 1;
    } while (lVar2 < iVar1);
  }
  if (iVar1 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
    local_20 = manifold;
    (*gContactEndedCallback)(&local_20);
  }
  manifold->m_cachedPoints = 0;
  return;
}

Assistant:

void cbtCollisionDispatcher::clearManifold(cbtPersistentManifold* manifold)
{
	manifold->clearManifold();
}